

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O3

_Bool check_arguments(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,
                     inform_error *err)

{
  size_t sVar1;
  inform_error iVar2;
  size_t sVar3;
  long lVar4;
  size_t i;
  long lVar5;
  double dVar6;
  double dVar7;
  
  if (series == (int *)0x0) {
    iVar2 = INFORM_ETIMESERIES;
  }
  else if (l == 0) {
    iVar2 = INFORM_ENOSOURCES;
  }
  else if (n == 0) {
    iVar2 = INFORM_ENOINITS;
  }
  else if (m == 0) {
    iVar2 = INFORM_ESHORTSERIES;
  }
  else if (b == (int *)0x0) {
    iVar2 = INFORM_EBASE;
  }
  else {
    if (r == (size_t *)0x0) {
      dVar6 = 0.0;
      sVar3 = 0;
      do {
        if (b[sVar3] < 2) goto LAB_0015dca9;
        dVar7 = log2((double)b[sVar3]);
        dVar6 = dVar6 + dVar7;
        sVar3 = sVar3 + 1;
      } while (l != sVar3);
    }
    else {
      sVar3 = 0;
      if (s == (size_t *)0x0) {
        do {
          if (r[sVar3] == 0) goto LAB_0015dbb8;
          if (m < r[sVar3]) goto LAB_0015dcb5;
          sVar3 = sVar3 + 1;
        } while (l != sVar3);
      }
      else {
        do {
          if (r[sVar3] == 0 && s[sVar3] == 0) goto LAB_0015dbb8;
          if (m < s[sVar3] + r[sVar3]) goto LAB_0015dcb5;
          sVar3 = sVar3 + 1;
        } while (l != sVar3);
      }
      dVar6 = 0.0;
      sVar3 = 0;
      do {
        if (b[sVar3] < 2) goto LAB_0015dca9;
        sVar1 = r[sVar3];
        dVar7 = log2((double)b[sVar3]);
        dVar6 = dVar6 + dVar7 * (((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) -
                                 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
        sVar3 = sVar3 + 1;
      } while (l != sVar3);
    }
    if (s != (size_t *)0x0) {
      sVar3 = 0;
      do {
        sVar1 = s[sVar3];
        dVar7 = log2((double)b[sVar3]);
        dVar6 = dVar6 + dVar7 * (((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) -
                                 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
        sVar3 = sVar3 + 1;
      } while (l != sVar3);
    }
    if (dVar6 <= 30.0) {
      lVar5 = m * n;
      sVar3 = 0;
      do {
        if (lVar5 != 0) {
          lVar4 = 0;
          do {
            if (series[lVar4] < 0) {
              iVar2 = INFORM_ENEGSTATE;
              goto LAB_0015dd08;
            }
            if (b[sVar3] <= series[lVar4]) {
              iVar2 = INFORM_EBADSTATE;
              goto LAB_0015dd08;
            }
            lVar4 = lVar4 + 1;
          } while (lVar5 - lVar4 != 0);
        }
        sVar3 = sVar3 + 1;
        series = series + lVar5;
        if (sVar3 == l) {
          return false;
        }
      } while( true );
    }
    iVar2 = INFORM_EENCODE;
  }
LAB_0015dd08:
  if (err != (inform_error *)0x0) {
    *err = iVar2;
  }
  return true;
LAB_0015dbb8:
  iVar2 = INFORM_EKZERO;
  goto LAB_0015dd08;
LAB_0015dcb5:
  iVar2 = INFORM_EKLONG;
  goto LAB_0015dd08;
LAB_0015dca9:
  iVar2 = INFORM_EBASE;
  goto LAB_0015dd08;
}

Assistant:

static bool check_arguments(int const *series, size_t l, size_t n, size_t m,
    int const *b, size_t const *r, size_t const *s, inform_error *err)
{

    if (series == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, true);
    }
    else if (l == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, true);
    }
    else if (n == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOINITS, true);
    }
    else if (m == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, true);
    }
    else if (b == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
    }
    else if (r != NULL)
    {
        if (s != NULL)
        {
            for (size_t i = 0; i < l; ++i)
            {
                if (r[i] == 0 && s[i] == 0)
                    INFORM_ERROR_RETURN(err, INFORM_EKZERO, true);
                if (r[i] + s[i] > m)
                    INFORM_ERROR_RETURN(err, INFORM_EKLONG, true);
            }
        }
        else
        {
            for (size_t i = 0; i < l; ++i)
            {
                if (r[i] == 0)
                    INFORM_ERROR_RETURN(err, INFORM_EKZERO, true);
                if (r[i] > m)
                    INFORM_ERROR_RETURN(err, INFORM_EKLONG, true);
            }
        }
    }
    double bits = 0.0;
    if (r != NULL)
    {
        for (size_t i = 0; i < l; ++i)
        {
            if (b[i] < 2)
            {
                INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
            }
            bits += r[i] * log2(b[i]);
        }
    }
    else
    {
        for (size_t i = 0; i < l; ++i)
        {
            if (b[i] < 2)
            {
                INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
            }
            bits += log2(b[i]);
        }
    }
    if (s != NULL)
    {
        for (size_t i = 0; i < l; ++i)
        {
            bits += s[i] * log2(b[i]);
        }
    }
    if (bits > 30.0)
    {
        INFORM_ERROR_RETURN(err, INFORM_EENCODE, true);
    }
    for (size_t i = 0; i < l; ++i)
    {
        for (size_t j = 0; j < n * m; ++j)
        {
            if (series[n*m*i + j] < 0)
            {
                INFORM_ERROR_RETURN(err, INFORM_ENEGSTATE, true);
            }
            else if (series[n*m*i + j] >= b[i])
            {
                INFORM_ERROR_RETURN(err, INFORM_EBADSTATE, true);
            }
        }
    }

    return false;
}